

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_estimateCDictSize(size_t dictSize,int compressionLevel)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined4 in_ESI;
  ZSTD_strategy in_EDI;
  ZSTD_compressionParameters cParams;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  ZSTD_getCParams(cParams.targetLength,cParams._8_8_,cParams._0_8_);
  cParams_00.hashLog = (int)in_stack_ffffffffffffffe8;
  cParams_00.searchLog = (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20);
  cParams_00.windowLog = (int)in_stack_ffffffffffffffe0;
  cParams_00.chainLog = (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20);
  cParams_00.searchLength = in_stack_fffffffffffffff0;
  cParams_00.targetLength = in_ESI;
  cParams_00.strategy = in_EDI;
  sVar1 = ZSTD_estimateCDictSize_advanced
                    (CONCAT44(in_stack_ffffffffffffffd4,in_stack_fffffffffffffff0),cParams_00,
                     (ZSTD_dictLoadMethod_e)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCDictSize(size_t dictSize, int compressionLevel)
{
    ZSTD_compressionParameters const cParams = ZSTD_getCParams(compressionLevel, 0, dictSize);
    return ZSTD_estimateCDictSize_advanced(dictSize, cParams, ZSTD_dlm_byCopy);
}